

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O0

void __thiscall
slang::analysis::AnalyzedAssertion::AnalyzedAssertion
          (AnalyzedAssertion *this,AnalysisContext *context,TimingControl *contextualClock,
          AnalyzedProcedure *procedure,Statement *stmt,Symbol *checkerInstance)

{
  SourceRange sourceRange;
  SourceRange range;
  SourceRange range_00;
  AnalyzedScope *pAVar1;
  size_type sVar2;
  SyntaxNode *pSVar3;
  Symbol *pSVar4;
  SourceLocation in_RSI;
  undefined8 *in_RDI;
  Statement *in_R8;
  long in_R9;
  SourceRange SVar5;
  Diagnostic *diag;
  size_t i;
  TimingControl *firstClock;
  VisitResult result;
  AssertionExpr *propSpec;
  ClockVisitor visitor;
  Symbol *in_stack_fffffffffffffe20;
  Symbol *in_stack_fffffffffffffe38;
  AnalyzedProcedure *in_stack_fffffffffffffe40;
  DiagCode code;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  ClockVisitor *in_stack_fffffffffffffe50;
  SyntaxNode *this_00;
  AnalyzedProcedure *in_stack_fffffffffffffe70;
  Scope *in_stack_fffffffffffffe78;
  AnalysisManager *in_stack_fffffffffffffe80;
  SyntaxNode *local_108;
  SmallVectorBase<const_slang::ast::TimingControl_*> local_f0;
  VisitFlags *in_stack_ffffffffffffff30;
  TimingControl **in_stack_ffffffffffffff38;
  ClockVisitor *in_stack_ffffffffffffff40;
  AssertionExpr *in_stack_ffffffffffffff48;
  byte local_36;
  
  *in_RDI = 0;
  if (in_R9 == 0) {
    not_null<const_slang::ast::Symbol_*>::operator*
              ((not_null<const_slang::ast::Symbol_*> *)0x80bd2a);
    ClockVisitor::ClockVisitor
              (in_stack_fffffffffffffe50,
               (AnalysisContext *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
               in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    ast::Statement::as<slang::ast::ConcurrentAssertionStatement>(in_R8);
    ast::AssertionExpr::
    visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::analysis::VisitFlags>
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff30);
    if (((local_36 & 1) == 0) &&
       (sVar2 = SmallVectorBase<const_slang::ast::TimingControl_*>::size(&local_f0), 1 < sVar2)) {
      SmallVectorBase<const_slang::ast::TimingControl_*>::operator[](&local_f0,0);
      local_108 = (SyntaxNode *)0x1;
      while (this_00 = local_108,
            pSVar3 = (SyntaxNode *)
                     SmallVectorBase<const_slang::ast::TimingControl_*>::size(&local_f0),
            this_00 < pSVar3) {
        SmallVectorBase<const_slang::ast::TimingControl_*>::operator[]
                  (&local_f0,(size_type)local_108);
        in_stack_fffffffffffffe4f =
             isSameClock((TimingControl *)
                         CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                         (TimingControl *)in_stack_fffffffffffffe40);
        if (!(bool)in_stack_fffffffffffffe4f) {
          pSVar4 = not_null<const_slang::ast::Symbol_*>::operator*
                             ((not_null<const_slang::ast::Symbol_*> *)0x80be96);
          code = SUB84((ulong)pSVar4 >> 0x20,0);
          SVar5 = slang::syntax::SyntaxNode::sourceRange(this_00);
          sourceRange.endLoc = in_RSI;
          sourceRange.startLoc = SVar5.startLoc;
          AnalysisContext::addDiag
                    ((AnalysisContext *)SVar5.endLoc,in_stack_fffffffffffffe20,code,sourceRange);
          range.endLoc = in_RSI;
          range.startLoc = SVar5.startLoc;
          Diagnostic::addNote((Diagnostic *)SVar5.endLoc,code,range);
          SmallVectorBase<const_slang::ast::TimingControl_*>::operator[]
                    (&local_f0,(size_type)local_108);
          range_00.endLoc = in_RSI;
          range_00.startLoc = SVar5.startLoc;
          Diagnostic::addNote((Diagnostic *)SVar5.endLoc,code,range_00);
          break;
        }
        local_108 = (SyntaxNode *)((long)&local_108->kind + 1);
      }
    }
    ClockVisitor::VisitResult::~VisitResult((VisitResult *)0x80c02e);
    ClockVisitor::~ClockVisitor((ClockVisitor *)0x80c03b);
  }
  else {
    not_null<slang::analysis::AnalysisManager_*>::operator->
              ((not_null<slang::analysis::AnalysisManager_*> *)0x80bcc6);
    ast::Symbol::as<slang::ast::CheckerInstanceSymbol>((Symbol *)0x80bcdb);
    pAVar1 = AnalysisManager::analyzeScopeBlocking
                       (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                        in_stack_fffffffffffffe70);
    *in_RDI = pAVar1;
  }
  return;
}

Assistant:

AnalyzedAssertion::AnalyzedAssertion(AnalysisContext& context, const TimingControl* contextualClock,
                                     const AnalyzedProcedure& procedure, const Statement& stmt,
                                     const Symbol* checkerInstance) {
    if (checkerInstance) {
        checkerScope = &context.manager->analyzeScopeBlocking(
            checkerInstance->as<CheckerInstanceSymbol>().body, &procedure);
    }
    else {
        ClockVisitor visitor(context, &procedure, *procedure.analyzedSymbol);

        auto& propSpec = stmt.as<ConcurrentAssertionStatement>().propertySpec;
        auto result = propSpec.visit(visitor, contextualClock, VisitFlags::None);

        if (!visitor.bad && result.clocks.size() > 1) {
            // There must be a unique semantic leading clock.
            auto firstClock = result.clocks[0];
            for (size_t i = 1; i < result.clocks.size(); i++) {
                if (!isSameClock(*firstClock, *result.clocks[i])) {
                    SLANG_ASSERT(propSpec.syntax);
                    auto& diag = context.addDiag(*procedure.analyzedSymbol, diag::NoUniqueClock,
                                                 propSpec.syntax->sourceRange());
                    diag.addNote(diag::NoteClockHere, firstClock->sourceRange);
                    diag.addNote(diag::NoteClockHere, result.clocks[i]->sourceRange);
                    break;
                }
            }
        }
    }
}